

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::ImageFeatureType::Clear(ImageFeatureType *this)

{
  this->width_ = 0;
  this->height_ = 0;
  this->colorspace_ = 0;
  clear_SizeFlexibility(this);
  return;
}

Assistant:

void ImageFeatureType::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ImageFeatureType)
  ::memset(&width_, 0, reinterpret_cast<char*>(&colorspace_) -
    reinterpret_cast<char*>(&width_) + sizeof(colorspace_));
  clear_SizeFlexibility();
}